

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

DdNode * Llb4_Nonlin4SweepBadMonitor(Aig_Man_t *pAig,Vec_Int_t *vOrder,DdManager *dd)

{
  abctime aVar1;
  int i;
  DdNode *n;
  Aig_Obj_t *pObj;
  DdNode *pDVar2;
  int i_00;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (i_00 = 0; i_00 < pAig->nTruePos; i_00 = i_00 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,i_00);
    i = Llb_ObjBddVar(vOrder,pObj);
    pDVar2 = Cudd_bddIthVar(dd,i);
    pDVar2 = Cudd_bddAnd(dd,n,(DdNode *)((ulong)pDVar2 ^ 1));
    Cudd_Ref(pDVar2);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar2;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return (DdNode *)((ulong)n ^ 1);
}

Assistant:

DdNode * Llb4_Nonlin4SweepBadMonitor( Aig_Man_t * pAig, Vec_Int_t * vOrder, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return Cudd_Not(bRes);
}